

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

void __thiscall despot::Logger::InitRound(Logger *this,State *state)

{
  int iVar1;
  log_ostream *plVar2;
  ostream *poVar3;
  
  this->step_ = 0;
  if (state != (State *)0x0) {
    this->state_ = state;
    iVar1 = logging::level();
    if (0 < iVar1) {
      iVar1 = logging::level();
      if (2 < iVar1) {
        plVar2 = logging::stream(3);
        poVar3 = std::operator<<(&plVar2->super_ostream,
                                 "[POMDPLogger::InitRound] Created start state.");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
    }
    if (((DAT_0019fe20 == '\0') && (this->out_ != (ostream *)0x0)) && (this->state_ != (State *)0x0)
       ) {
      poVar3 = std::operator<<(this->out_,"Initial state: ");
      std::endl<char,std::char_traits<char>>(poVar3);
      (*this->world_->_vptr_World[5])(this->world_,this->state_,this->out_);
      std::endl<char,std::char_traits<char>>(this->out_);
    }
  }
  this->total_discounted_reward_ = 0.0;
  this->total_undiscounted_reward_ = 0.0;
  return;
}

Assistant:

void Logger::InitRound(State* state) {
	step_ = 0;

	if (state) {
		state_ = state;
		logi << "[POMDPLogger::InitRound] Created start state." << endl;
		// Print initial state
		if (!Globals::config.silence && out_) {

			if (state_){
				*out_ << "Initial state: " << endl;
				world_->PrintState(*state_, *out_);
				*out_ << endl;
			}
		}
	}

	total_discounted_reward_ = 0;
	total_undiscounted_reward_ = 0;
}